

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O3

XMLSize_t __thiscall
xercesc_4_0::DOMRangeImpl::indexOf(DOMRangeImpl *this,DOMNode *child,DOMNode *parent)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar2;
  XMLSize_t XVar3;
  
  iVar1 = (*child->_vptr_DOMNode[5])(child);
  XVar3 = 0xffffffffffffffff;
  if ((DOMNode *)CONCAT44(extraout_var,iVar1) == parent) {
    iVar1 = (*child->_vptr_DOMNode[9])(child);
    XVar3 = 0;
    for (plVar2 = (long *)CONCAT44(extraout_var_00,iVar1); plVar2 != (long *)0x0;
        plVar2 = (long *)(**(code **)(*plVar2 + 0x48))(plVar2)) {
      XVar3 = XVar3 + 1;
    }
  }
  return XVar3;
}

Assistant:

XMLSize_t DOMRangeImpl::indexOf(const DOMNode* child, const DOMNode* parent) const
{
    XMLSize_t i = 0;
    if (child->getParentNode() != parent) return (XMLSize_t)-1;
    for(DOMNode* node = child->getPreviousSibling(); node!= 0; node=node->getPreviousSibling()) {
        i++;
    }
    return i;
}